

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O0

void __thiscall
RegisterPathEscapingSensiblePathsAreNotNeedlesslyEscaped::
RegisterPathEscapingSensiblePathsAreNotNeedlesslyEscaped
          (RegisterPathEscapingSensiblePathsAreNotNeedlesslyEscaped *this)

{
  RegisterPathEscapingSensiblePathsAreNotNeedlesslyEscaped *this_local;
  
  RegisterTest(PathEscapingSensiblePathsAreNotNeedlesslyEscaped::Create,
               "PathEscaping.SensiblePathsAreNotNeedlesslyEscaped");
  return;
}

Assistant:

TEST(PathEscaping, SensiblePathsAreNotNeedlesslyEscaped) {
  const char* path = "some/sensible/path/without/crazy/characters.c++";
  string result;

  GetWin32EscapedString(path, &result);
  EXPECT_EQ(path, result);
  result.clear();

  GetShellEscapedString(path, &result);
  EXPECT_EQ(path, result);
}